

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

void __thiscall mkvparser::Cues::~Cues(Cues *this)

{
  long lVar1;
  long lVar2;
  undefined8 *puVar3;
  void *pvVar4;
  undefined8 *puVar5;
  long in_RDI;
  CuePoint *pCP;
  CuePoint **q;
  CuePoint **p;
  long n;
  CuePoint *in_stack_ffffffffffffffc0;
  undefined8 *local_18;
  
  lVar1 = *(long *)(in_RDI + 0x30);
  lVar2 = *(long *)(in_RDI + 0x38);
  puVar3 = *(undefined8 **)(in_RDI + 0x28);
  local_18 = puVar3;
  while (local_18 != puVar3 + lVar1 + lVar2) {
    puVar5 = local_18 + 1;
    pvVar4 = (void *)*local_18;
    local_18 = puVar5;
    if (pvVar4 != (void *)0x0) {
      CuePoint::~CuePoint(in_stack_ffffffffffffffc0);
      operator_delete(pvVar4);
    }
  }
  if (*(void **)(in_RDI + 0x28) != (void *)0x0) {
    operator_delete__(*(void **)(in_RDI + 0x28));
  }
  return;
}

Assistant:

Cues::~Cues() {
  const long n = m_count + m_preload_count;

  CuePoint** p = m_cue_points;
  CuePoint** const q = p + n;

  while (p != q) {
    CuePoint* const pCP = *p++;
    assert(pCP);

    delete pCP;
  }

  delete[] m_cue_points;
}